

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.c
# Opt level: O2

void OPLResetChip(FM_OPL *OPL)

{
  YM_DELTAT *DELTAT;
  long lVar1;
  uint uVar2;
  
  OPL->eg_cnt = 0;
  OPL->eg_timer = 0;
  OPL->noise_rng = 1;
  OPL->mode = '\0';
  OPL_STATUS_RESET(OPL,0x7f);
  if ((OPL->type & 1) != 0) {
    OPL->wavesel = '\0';
  }
  OPL->T[0] = 0x400;
  OPL->T[1] = 0x1000;
  OPLWriteReg(OPL,'\x04','\0');
  for (uVar2 = 0xff; 0x1f < uVar2; uVar2 = uVar2 - 1) {
    OPLWriteReg(OPL,(UINT8)uVar2,'\0');
  }
  for (lVar1 = 0; lVar1 != 0x6c0; lVar1 = lVar1 + 0xc0) {
    *(undefined2 *)((long)OPL->P_CH[0].SLOT[0].op1_out + lVar1 + 0x2e) = 0;
    *(undefined1 *)((long)OPL->P_CH[0].SLOT[0].op1_out + lVar1 + 10) = 0;
    *(undefined4 *)((long)OPL->P_CH[0].SLOT[0].op1_out + lVar1 + 0x14) = 0x1ff;
    *(undefined2 *)((long)OPL->P_CH[0].SLOT[1].op1_out + lVar1 + 0x2e) = 0;
    *(undefined1 *)((long)OPL->P_CH[0].SLOT[1].op1_out + lVar1 + 10) = 0;
    *(undefined4 *)((long)OPL->P_CH[0].SLOT[1].op1_out + lVar1 + 0x14) = 0x1ff;
  }
  if ((OPL->type & 2) == 0) {
    return;
  }
  DELTAT = OPL->deltat;
  DELTAT->freqbase = OPL->freqbase;
  YM_DELTAT_ADPCM_Reset(DELTAT,0);
  return;
}

Assistant:

static void OPLResetChip(FM_OPL *OPL)
{
	int c,s;
	int i;

	OPL->eg_timer = 0;
	OPL->eg_cnt   = 0;

	OPL->noise_rng = 1; /* noise shift register */
	OPL->mode   = 0;    /* normal mode */
	OPL_STATUS_RESET(OPL,0x7f);

	/* reset with register write */
	OPLWriteReg(OPL,0x01,0); /* wavesel disable */
	OPLWriteReg(OPL,0x02,0); /* Timer1 */
	OPLWriteReg(OPL,0x03,0); /* Timer2 */
	OPLWriteReg(OPL,0x04,0); /* IRQ mask clear */
	for(i = 0xff ; i >= 0x20 ; i-- ) OPLWriteReg(OPL,i,0);

	/* reset operator parameters */
	for( c = 0 ; c < 9 ; c++ )
	{
		OPL_CH *CH = &OPL->P_CH[c];
		for(s = 0 ; s < 2 ; s++ )
		{
			/* wave table */
			CH->SLOT[s].wavetable = 0;
			CH->SLOT[s].state     = EG_OFF;
			CH->SLOT[s].volume    = MAX_ATT_INDEX;
		}
	}
#if BUILD_Y8950
	if(OPL->type&OPL_TYPE_ADPCM)
	{
		YM_DELTAT *DELTAT = OPL->deltat;

		DELTAT->freqbase = OPL->freqbase;
		YM_DELTAT_ADPCM_Reset(DELTAT,0);
	}
#endif
}